

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Vfs_chown(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uint iBool;
  
  if ((1 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pvVar1 = pCtx->pFunc->pUserData;
    if ((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 0x70) != 0)) {
      pcVar3 = jx9_value_to_string(*apArg,(int *)0x0);
      pcVar4 = jx9_value_to_string(apArg[1],(int *)0x0);
      iVar2 = (**(code **)((long)pvVar1 + 0x70))(pcVar3,pcVar4);
      iBool = (uint)(iVar2 == 0);
      goto LAB_00133615;
    }
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString);
  }
  iBool = 0;
LAB_00133615:
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int jx9Vfs_chown(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath, *zUser;
	jx9_vfs *pVfs;
	int rc;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xChown == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the desired directory */
	zPath = jx9_value_to_string(apArg[0], 0);
	/* Extract the user */
	zUser = jx9_value_to_string(apArg[1], 0);
	/* Perform the requested operation */
	rc = pVfs->xChown(zPath, zUser);
	/* IO return value */
	jx9_result_bool(pCtx, rc == JX9_OK);
	return JX9_OK;
}